

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

string * __thiscall
cs_impl::any::holder<cs::structure>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,holder<cs::structure> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  var *pvVar5;
  undefined4 extraout_var;
  undefined *puVar6;
  long *plVar7;
  size_type *psVar8;
  bool bVar9;
  var func;
  var local_68;
  key_arg<std::__cxx11::basic_string<char>_> local_60;
  any local_40;
  structure *local_38;
  
  paVar1 = &local_60.field_2;
  local_60.field_2._M_allocated_capacity = 0x6e697274735f6f74;
  local_60.field_2._8_2_ = 0x67;
  local_60._M_string_length = 9;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  sVar4 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      *)(this->mDat).m_data.
                        super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (sVar4 != 0) {
    local_60.field_2._M_allocated_capacity = 0x6e697274735f6f74;
    local_60.field_2._8_2_ = 0x67;
    local_60._M_string_length = 9;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    pvVar5 = cs::domain_type::get_var
                       ((this->mDat).m_data.
                        super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &local_60);
    local_68.mDat = pvVar5->mDat;
    if (local_68.mDat != (proxy *)0x0) {
      (local_68.mDat)->refcount = (local_68.mDat)->refcount + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_68.mDat == (proxy *)0x0) {
      puVar6 = &void::typeinfo;
    }
    else {
      iVar3 = (*(local_68.mDat)->data->_vptr_baseHolder[2])();
      puVar6 = (undefined *)CONCAT44(extraout_var,iVar3);
    }
    __s1 = *(char **)(puVar6 + 8);
    if (__s1 == "N2cs8callableE") {
      bVar9 = true;
    }
    else if (*__s1 == '*') {
      bVar9 = false;
    }
    else {
      iVar3 = strcmp(__s1,"N2cs8callableE");
      bVar9 = iVar3 == 0;
    }
    if (bVar9) {
      local_38 = &this->mDat;
      make<cs::structure,cs::structure_const*>(&local_40,&local_38);
      cs::invoke<cs_impl::any>((cs *)&local_60,&local_68,&local_40);
      any::to_string_abi_cxx11_(__return_storage_ptr__,(any *)&local_60);
      recycle((any *)&local_60);
      recycle(&local_40);
      recycle(&local_68);
      if (bVar9) {
        return __return_storage_ptr__;
      }
    }
    else {
      recycle(&local_68);
    }
  }
  std::operator+(&local_60,"[cs::structure_",&(this->mDat).m_name);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar8) {
    lVar2 = plVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}